

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.h
# Opt level: O0

int __thiscall CVmRun::pop2_compare_le(CVmRun *this)

{
  int iVar1;
  vm_val_t *in_RDI;
  int ret;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  CVmStack::get(1);
  CVmStack::get(0);
  iVar1 = vm_val_t::is_le(in_RDI,(vm_val_t *)
                                 CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  CVmStack::discard(2);
  return iVar1;
}

Assistant:

int pop2_compare_le(VMG0_)
    {
        /* compare the values and return the result */
        int ret = get(1)->is_le(vmg_ get(0));

        /* discard the values */
        discard(2);

        /* return the result */
        return ret;
    }